

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O0

void OPENSSL_sk_delete_if
               (OPENSSL_STACK *sk,OPENSSL_sk_call_delete_if_func call_func,
               OPENSSL_sk_delete_if_func func,void *data)

{
  int iVar1;
  ulong local_38;
  size_t i;
  size_t new_num;
  void *data_local;
  OPENSSL_sk_delete_if_func func_local;
  OPENSSL_sk_call_delete_if_func call_func_local;
  OPENSSL_STACK *sk_local;
  
  if (sk != (OPENSSL_STACK *)0x0) {
    i = 0;
    for (local_38 = 0; local_38 < sk->num; local_38 = local_38 + 1) {
      iVar1 = (*call_func)(func,sk->data[local_38],data);
      if (iVar1 == 0) {
        sk->data[i] = sk->data[local_38];
        i = i + 1;
      }
    }
    sk->num = i;
  }
  return;
}

Assistant:

void OPENSSL_sk_delete_if(OPENSSL_STACK *sk,
                          OPENSSL_sk_call_delete_if_func call_func,
                          OPENSSL_sk_delete_if_func func, void *data) {
  if (sk == NULL) {
    return;
  }

  size_t new_num = 0;
  for (size_t i = 0; i < sk->num; i++) {
    if (!call_func(func, sk->data[i], data)) {
      sk->data[new_num] = sk->data[i];
      new_num++;
    }
  }
  sk->num = new_num;
}